

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_descriptor.hpp
# Opt level: O0

size_t __thiscall
boost::asio::posix::stream_descriptor::read_some<boost::asio::mutable_buffers_1>
          (stream_descriptor *this,mutable_buffers_1 *buffers)

{
  service_type *err;
  size_t sVar1;
  basic_io_object<boost::asio::detail::reactive_descriptor_service,_true> *in_RDI;
  mutable_buffers_1 *unaff_retaddr;
  implementation_type *in_stack_00000008;
  size_t s;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  basic_io_object<boost::asio::detail::reactive_descriptor_service,_true> *ec_00;
  
  ec_00 = in_RDI;
  system::error_code::error_code(in_stack_ffffffffffffffd0);
  err = basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>::get_service(in_RDI)
  ;
  basic_io_object<boost::asio::detail::reactive_descriptor_service,_true>::get_implementation
            (in_RDI);
  sVar1 = detail::reactive_descriptor_service::read_some<boost::asio::mutable_buffers_1>
                    ((reactive_descriptor_service *)s,in_stack_00000008,unaff_retaddr,
                     (error_code *)ec_00);
  detail::throw_error((error_code *)err,(char *)in_RDI);
  return sVar1;
}

Assistant:

std::size_t read_some(const MutableBufferSequence& buffers)
  {
    boost::system::error_code ec;
    std::size_t s = this->get_service().read_some(
        this->get_implementation(), buffers, ec);
    boost::asio::detail::throw_error(ec, "read_some");
    return s;
  }